

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListModeViewBase::updateHorizontalScrollBar(QListModeViewBase *this,QSize *step)

{
  QListViewPrivate *pQVar1;
  QWidgetData *pQVar2;
  ScrollMode SVar3;
  int step_00;
  QScrollBar *pQVar4;
  bool wrap;
  long lVar5;
  int iVar6;
  
  SVar3 = QAbstractItemView::horizontalScrollMode
                    ((QAbstractItemView *)(this->super_QCommonListViewBase).qq);
  if (SVar3 == ScrollPerItem) {
    pQVar1 = (this->super_QCommonListViewBase).dd;
    if (pQVar1->flow == LeftToRight) {
      wrap = pQVar1->wrap;
      lVar5 = 0x88;
      if (wrap == false) {
LAB_0057041d:
        iVar6 = *(int *)((long)&(this->super_QCommonListViewBase).qq + lVar5) + -1;
        if (iVar6 < 1) {
          pQVar4 = QAbstractScrollArea::horizontalScrollBar
                             ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
          iVar6 = 0;
        }
        else {
          pQVar2 = ((pQVar1->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          step_00 = perItemScrollingPageSteps
                              (this,((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1,
                               (this->super_QCommonListViewBase).contentsSize.wd.m_i,wrap);
          pQVar4 = QAbstractScrollArea::horizontalScrollBar
                             ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
          QAbstractSlider::setSingleStep(&pQVar4->super_QAbstractSlider,1);
          pQVar4 = QAbstractScrollArea::horizontalScrollBar
                             ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
          QAbstractSlider::setPageStep(&pQVar4->super_QAbstractSlider,step_00);
          pQVar4 = QAbstractScrollArea::horizontalScrollBar
                             ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
          iVar6 = iVar6 - step_00;
        }
        QAbstractSlider::setRange(&pQVar4->super_QAbstractSlider,0,iVar6);
        return;
      }
    }
    else if (pQVar1->flow == TopToBottom) {
      wrap = pQVar1->wrap;
      lVar5 = 0x40;
      if (wrap != false) goto LAB_0057041d;
    }
  }
  QCommonListViewBase::updateHorizontalScrollBar(&this->super_QCommonListViewBase,step);
  return;
}

Assistant:

void QListModeViewBase::updateHorizontalScrollBar(const QSize &step)
{
    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem
        && ((flow() == QListView::TopToBottom && isWrapping())
        || (flow() == QListView::LeftToRight && !isWrapping()))) {
            int steps = (flow() == QListView::TopToBottom ? segmentPositions : scrollValueMap).size() - 1;
            if (steps > 0) {
                const int pageSteps = perItemScrollingPageSteps(viewport()->width(), contentsSize.width(), isWrapping());
                horizontalScrollBar()->setSingleStep(1);
                horizontalScrollBar()->setPageStep(pageSteps);
                horizontalScrollBar()->setRange(0, steps - pageSteps);
            } else {
                horizontalScrollBar()->setRange(0, 0);
            }
    } else {
        QCommonListViewBase::updateHorizontalScrollBar(step);
    }
}